

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O3

void mbedtls_x509_csr_free(mbedtls_x509_csr *csr)

{
  mbedtls_asn1_named_data *pmVar1;
  size_t sVar2;
  mbedtls_asn1_named_data *__ptr;
  long lVar3;
  size_t sVar4;
  uchar *__ptr_00;
  
  if (csr != (mbedtls_x509_csr *)0x0) {
    mbedtls_pk_free(&csr->pk);
    free(csr->sig_opts);
    __ptr = (csr->subject).next;
    while (__ptr != (mbedtls_asn1_named_data *)0x0) {
      pmVar1 = __ptr->next;
      lVar3 = 0;
      do {
        *(undefined1 *)((long)&(__ptr->oid).tag + lVar3) = 0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      free(__ptr);
      __ptr = pmVar1;
    }
    __ptr_00 = (csr->raw).p;
    if (__ptr_00 != (uchar *)0x0) {
      sVar2 = (csr->raw).len;
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          __ptr_00[sVar4] = '\0';
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
        __ptr_00 = (csr->raw).p;
      }
      free(__ptr_00);
    }
    lVar3 = 0;
    do {
      *(undefined1 *)((long)&(csr->raw).tag + lVar3) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe0);
  }
  return;
}

Assistant:

void mbedtls_x509_csr_free( mbedtls_x509_csr *csr )
{
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;

    if( csr == NULL )
        return;

    mbedtls_pk_free( &csr->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    mbedtls_free( csr->sig_opts );
#endif

    name_cur = csr->subject.next;
    while( name_cur != NULL )
    {
        name_prv = name_cur;
        name_cur = name_cur->next;
        mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
        mbedtls_free( name_prv );
    }

    if( csr->raw.p != NULL )
    {
        mbedtls_zeroize( csr->raw.p, csr->raw.len );
        mbedtls_free( csr->raw.p );
    }

    mbedtls_zeroize( csr, sizeof( mbedtls_x509_csr ) );
}